

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O0

void __thiscall TimerHeap::downHeap(TimerHeap *this,size_t index)

{
  bool bVar1;
  long lVar2;
  size_type sVar3;
  __shared_ptr_access<Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var4;
  element_type *peVar5;
  element_type *peVar6;
  ulong local_20;
  size_t child;
  size_t index_local;
  TimerHeap *this_local;
  
  lVar2 = index * 2;
  child = index;
  while( true ) {
    local_20 = lVar2 + 1;
    sVar3 = std::vector<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>::size
                      (&this->timerHeap_);
    if (sVar3 <= local_20) {
      return;
    }
    sVar3 = std::vector<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>::size
                      (&this->timerHeap_);
    if (lVar2 + 2U < sVar3) {
      p_Var4 = (__shared_ptr_access<Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               std::vector<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>::
               operator[](&this->timerHeap_,lVar2 + 2);
      peVar5 = std::__shared_ptr_access<Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         (p_Var4);
      p_Var4 = (__shared_ptr_access<Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               std::vector<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>::
               operator[](&this->timerHeap_,local_20);
      peVar6 = std::__shared_ptr_access<Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         (p_Var4);
      bVar1 = Timer::timeType_::operator<(&peVar5->timeout_,&peVar6->timeout_);
      if (bVar1) {
        local_20 = lVar2 + 2;
      }
    }
    p_Var4 = (__shared_ptr_access<Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             std::vector<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>::
             operator[](&this->timerHeap_,child);
    peVar5 = std::__shared_ptr_access<Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       (p_Var4);
    p_Var4 = (__shared_ptr_access<Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             std::vector<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>::
             operator[](&this->timerHeap_,local_20);
    peVar6 = std::__shared_ptr_access<Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       (p_Var4);
    bVar1 = Timer::timeType_::operator<(&peVar5->timeout_,&peVar6->timeout_);
    if (bVar1) break;
    swapHeap(this,child,local_20);
    child = local_20;
    lVar2 = local_20 * 2;
  }
  return;
}

Assistant:

void TimerHeap::downHeap(size_t index) {
    size_t child = index * 2 + 1;
    while (child < timerHeap_.size()) {
        if (child + 1 < timerHeap_.size() && timerHeap_[child + 1]->timeout_ < timerHeap_[child]->timeout_) 
            ++child;
        if (timerHeap_[index]->timeout_ < timerHeap_[child]->timeout_) 
            break;
        swapHeap(index, child);
        index = child;
        child = index * 2 + 1;
    }
}